

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.c
# Opt level: O0

int MeasureText(char *text,int fontSize)

{
  Font font;
  int iVar1;
  Vector2 VVar2;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  CharInfo *pCStack_68;
  int spacing;
  int defaultFontSize;
  int local_44;
  float local_1c [2];
  Vector2 vec;
  int fontSize_local;
  char *text_local;
  
  vec.x = (float)fontSize;
  unique0x10000215 = text;
  memset(local_1c,0,8);
  GetFontDefault();
  if (local_44 != 0) {
    if ((int)vec.x < 10) {
      vec.x = 1.4013e-44;
    }
    iVar1 = (int)vec.x / 10;
    GetFontDefault();
    font._8_8_ = uStack_88;
    font._0_8_ = local_90;
    font.texture._4_8_ = local_80;
    font.texture._12_8_ = uStack_78;
    font.recs = (Rectangle *)local_70;
    font.chars = pCStack_68;
    VVar2 = MeasureTextEx(font,stack0xfffffffffffffff0,(float)(int)vec.x,(float)iVar1);
    local_1c[0] = VVar2.x;
  }
  return (int)local_1c[0];
}

Assistant:

int MeasureText(const char *text, int fontSize)
{
    Vector2 vec = { 0.0f, 0.0f };

    // Check if default font has been loaded
    if (GetFontDefault().texture.id != 0)
    {
        int defaultFontSize = 10;   // Default Font chars height in pixel
        if (fontSize < defaultFontSize) fontSize = defaultFontSize;
        int spacing = fontSize/defaultFontSize;

        vec = MeasureTextEx(GetFontDefault(), text, (float)fontSize, (float)spacing);
    }

    return (int)vec.x;
}